

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O3

pair<std::pair<const_int,_int>_*,_std::pair<const_int,_int>_*> __thiscall
frozen::unordered_map<int,_int,_3UL,_frozen::elsa<int>,_std::equal_to<int>_>::equal_range<int>
          (unordered_map<int,_int,_3UL,_frozen::elsa<int>,_std::equal_to<int>_> *this,int *key)

{
  tables_type *this_00;
  size_t sVar1;
  pair<const_int,_int> *ppVar2;
  pair<const_int,_int> *ppVar3;
  bool bVar4;
  pair<std::pair<const_int,_int>_*,_std::pair<const_int,_int>_*> pVar5;
  
  this_00 = &this->tables_;
  sVar1 = bits::pmh_tables<8ul,frozen::elsa<int>>::lookup<int,frozen::elsa<int>>
                    ((pmh_tables<8ul,frozen::elsa<int>> *)this_00,key,(elsa<int> *)this_00);
  ppVar3 = (pair<const_int,_int> *)this_00;
  ppVar2 = (pair<const_int,_int> *)this_00;
  if (sVar1 != 3) {
    bVar4 = (this->items_).data_[sVar1].first != *key;
    ppVar2 = (this->items_).data_ + sVar1;
    if (bVar4) {
      ppVar2 = (pair<const_int,_int> *)this_00;
    }
    ppVar3 = (this->items_).data_ + sVar1 + 1;
    if (bVar4) {
      ppVar3 = (pair<const_int,_int> *)this_00;
    }
  }
  pVar5.second = ppVar3;
  pVar5.first = ppVar2;
  return pVar5;
}

Assistant:

constexpr std::pair<iterator, iterator> equal_range(KeyType const &key) {
    return equal_range_impl(*this, key);
  }